

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall
DomConnectionHint::read(DomConnectionHint *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  int iVar2;
  undefined4 in_register_00000034;
  QString *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  pQVar3 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar4 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar4 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x10);
      if ((local_68.m_size == 4) &&
         (QVar5.m_data = local_68.m_data, QVar5.m_size = 4, QVar8.m_data = L"type", QVar8.m_size = 4
         , cVar1 = QtPrivate::equalStrings(QVar5,QVar8), cVar1 != '\0')) {
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar4 + 0x50),
                         *(longlong *)(local_50.ptr + lVar4 + 0x58));
        QString::operator=(&this->m_attr_type,&local_80);
        this->m_has_attr_type = true;
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError(pQVar3);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar4 = lVar4 + 0x68;
    } while (local_50.size * 0x68 != lVar4);
  }
  iVar2 = QXmlStreamReader::error();
  if (iVar2 == 0) {
    do {
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar9.m_data = L"x";
        QVar9.m_size = 1;
        iVar2 = QtPrivate::compareStrings(local_68,QVar9,CaseInsensitive);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_80,pQVar3,0);
          QVar6.m_data = local_80.d.ptr;
          QVar6.m_size = local_80.d.size;
          lVar4 = QString::toIntegral_helper(QVar6,(bool *)0x0,10);
          iVar2 = (int)lVar4;
          if ((int)lVar4 != lVar4) {
            iVar2 = 0;
          }
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this->m_x = iVar2;
        }
        else {
          QVar10.m_data = L"y";
          QVar10.m_size = 1;
          iVar2 = QtPrivate::compareStrings(local_68,QVar10,CaseInsensitive);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_80,pQVar3,0);
            QVar7.m_data = local_80.d.ptr;
            QVar7.m_size = local_80.d.size;
            lVar4 = QString::toIntegral_helper(QVar7,(bool *)0x0,10);
            iVar2 = (int)lVar4;
            if ((int)lVar4 != lVar4) {
              iVar2 = 0;
            }
            *(byte *)&this->m_children = (byte)this->m_children | 2;
            this->m_y = iVar2;
          }
          else {
            local_98.a.m_size = 0x13;
            local_98.a.m_data = "Unexpected element ";
            local_98.b = &local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      (&local_80,&local_98);
            QXmlStreamReader::raiseError(pQVar3);
          }
        }
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar2 == 5) break;
      iVar2 = QXmlStreamReader::error();
    } while (iVar2 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomConnectionHint::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"type"_s) {
            setAttributeType(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"x"_s, Qt::CaseInsensitive)) {
                setElementX(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"y"_s, Qt::CaseInsensitive)) {
                setElementY(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}